

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatMemory.h
# Opt level: O0

xSAT_Mem_t * xSAT_MemAlloc(int nCap)

{
  xSAT_Mem_t *p_00;
  xSAT_Mem_t *p;
  int nCap_local;
  
  p_00 = (xSAT_Mem_t *)calloc(1,0x18);
  p._4_4_ = nCap;
  if (nCap < 1) {
    p._4_4_ = 0x100000;
  }
  xSAT_MemGrow(p_00,p._4_4_);
  return p_00;
}

Assistant:

static inline xSAT_Mem_t * xSAT_MemAlloc( int nCap )
{
    xSAT_Mem_t * p;
    p = ABC_CALLOC( xSAT_Mem_t, 1 );
    if (nCap <= 0)
        nCap = 1024*1024;

    xSAT_MemGrow(p, nCap);
    return p;
}